

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,RenderParams *params)

{
  ostringstream *poVar1;
  uint uVar2;
  SamplerType SVar3;
  code *pcVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  deUint32 err;
  undefined4 extraout_var;
  ShaderProgram *shaderProgram;
  long *plVar8;
  Program PVar9;
  Program program;
  uint uVar10;
  long lVar11;
  undefined4 local_28c;
  undefined1 local_278 [8];
  long *local_270;
  deUint16 *local_268;
  long local_260 [2];
  int local_250;
  float local_248;
  float local_244;
  undefined4 local_240;
  float local_23c;
  float local_238;
  float local_234;
  undefined4 local_230;
  undefined8 local_22c;
  float local_224;
  undefined4 local_220;
  float local_21c;
  float local_218;
  float local_214;
  undefined4 local_210;
  float local_20c;
  float *local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [24];
  char local_1a0 [16];
  int local_190;
  VertexComponentType local_188;
  VertexComponentConversion VStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  float *local_170;
  PrimitiveType local_168;
  long *local_160 [2];
  long local_150 [2];
  ios_base local_140 [8];
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_12c;
  float *local_120;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  uVar2 = params->flags;
  if ((uVar2 & 1) == 0) {
    local_23c = 1.0;
    local_234 = 1.0;
    local_21c = 1.0;
    local_218 = 1.0;
  }
  else {
    local_23c = (params->w).m_data[0];
    local_234 = (params->w).m_data[1];
    local_21c = (params->w).m_data[2];
    local_218 = (params->w).m_data[3];
  }
  uVar10 = uVar2 & 2;
  local_248 = -local_23c;
  local_240 = 0;
  local_230 = 0;
  local_238 = -local_234;
  local_22c = CONCAT44(local_21c,local_234);
  local_224 = -local_21c;
  local_220 = 0;
  local_210 = 0;
  PVar9 = PROGRAM_LAST;
  program = PROGRAM_LAST;
  switch(params->texType) {
  case TEXTURETYPE_2D:
    program = PVar9;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      local_28c = 2;
      program = uVar10 * 2;
      break;
    case SAMPLERTYPE_INT:
      local_28c = 2;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_INT;
      break;
    case SAMPLERTYPE_UINT:
      local_28c = 2;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      local_28c = 2;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_2D_SHADOW;
      break;
    default:
      goto switchD_0049e32f_default;
    }
    break;
  case TEXTURETYPE_CUBE:
    program = PVar9;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_INT;
      break;
    case SAMPLERTYPE_UINT:
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_CUBE_SHADOW;
      break;
    default:
      goto switchD_0049e3e9_default;
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    program = PROGRAM_LAST;
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x1c;
    }
    goto switchD_0049e3e9_default;
  case TEXTURETYPE_3D:
    SVar3 = params->samplerType;
    if (SVar3 == SAMPLERTYPE_UINT) {
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_UINT;
      break;
    }
    if (SVar3 == SAMPLERTYPE_INT) {
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_INT;
      break;
    }
    program = PVar9;
    if (SVar3 == SAMPLERTYPE_FLOAT) {
      local_28c = 3;
      program = (uint)(uVar10 != 0) * 3 + PROGRAM_3D_FLOAT;
      break;
    }
switchD_0049e3e9_default:
    local_28c = 3;
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    program = PROGRAM_LAST;
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x26;
    }
    local_28c = 4;
    break;
  case TEXTURETYPE_1D:
    program = PVar9;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      local_28c = 1;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      local_28c = 1;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_INT;
      break;
    case SAMPLERTYPE_UINT:
      local_28c = 1;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      local_28c = 1;
      program = (uint)(uVar10 != 0) * 4 + PROGRAM_1D_SHADOW;
      break;
    default:
      goto switchD_0049e420_default;
    }
    break;
  case TEXTURETYPE_1D_ARRAY:
    program = PROGRAM_LAST;
    if (params->samplerType < SAMPLERTYPE_FETCH_FLOAT) {
      program = params->samplerType + 0x18;
    }
switchD_0049e32f_default:
    local_28c = 2;
    break;
  case TEXTURETYPE_BUFFER:
    program = PROGRAM_LAST;
    if (params->samplerType - SAMPLERTYPE_FETCH_FLOAT < 3) {
      program = params->samplerType + 0x26;
    }
switchD_0049e420_default:
    local_28c = 1;
    break;
  default:
    local_28c = 0;
  }
  local_244 = local_248;
  local_214 = local_218;
  local_20c = local_218;
  local_200 = texCoord;
  shaderProgram = ProgramLibrary::getProgram(&this->m_programLibrary,program);
  if ((params->flags & 4) != 0) {
    glu::operator<<(this->m_log,shaderProgram);
  }
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"Set vertex attributes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1b6);
  dVar6 = (shaderProgram->m_program).m_program;
  (**(code **)(lVar11 + 0x1680))(dVar6);
  pcVar4 = *(code **)(lVar11 + 0x14f0);
  uVar7 = (**(code **)(lVar11 + 0xb48))(dVar6,"u_sampler");
  (*pcVar4)(uVar7,texUnit);
  if ((uVar2 & 8) != 0) {
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"u_sampler = ",0xc);
    std::ostream::operator<<(poVar1,texUnit);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  if (uVar10 != 0) {
    pcVar4 = *(code **)(lVar11 + 0x14e0);
    uVar7 = (**(code **)(lVar11 + 0xb48))(dVar6,"u_bias");
    (*pcVar4)(params->bias,uVar7);
    if ((uVar2 & 8) != 0) {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"u_bias = ",9);
      std::ostream::_M_insert<double>((double)params->bias);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
    }
  }
  if (params->samplerType == SAMPLERTYPE_SHADOW) {
    pcVar4 = *(code **)(lVar11 + 0x14e0);
    uVar7 = (**(code **)(lVar11 + 0xb48))(dVar6,"u_ref");
    (*pcVar4)(params->ref,uVar7);
    if ((uVar2 & 8) != 0) {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"u_ref = ",8);
      std::ostream::_M_insert<double>((double)params->ref);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
    }
  }
  pcVar4 = *(code **)(lVar11 + 0x15a8);
  uVar7 = (**(code **)(lVar11 + 0xb48))(dVar6,"u_colorScale");
  (*pcVar4)(uVar7,1,&params->colorScale);
  pcVar4 = *(code **)(lVar11 + 0x15a8);
  uVar7 = (**(code **)(lVar11 + 0xb48))(dVar6,"u_colorBias");
  (*pcVar4)(uVar7,1,&params->colorBias);
  if ((uVar2 & 8) != 0) {
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"u_colorScale = ",0xf);
    tcu::operator<<((ostream *)poVar1,&params->colorScale);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"u_colorBias = ",0xe);
    tcu::operator<<((ostream *)poVar1,&params->colorBias);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  err = (**(code **)(lVar11 + 0x800))();
  glu::checkError(err,"Set program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1d7);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"a_position","");
  local_278._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_1d8,local_1d0 + (long)local_1d8);
  local_250 = 0;
  local_1b8._0_4_ = local_278._0_4_;
  local_1b8._8_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1b8 + 8),local_270,(long)local_268 + (long)local_270);
  local_190 = local_250;
  local_188 = VTX_COMP_FLOAT;
  VStack_184 = VTX_COMP_CONVERT_NONE;
  iStack_180 = 4;
  iStack_17c = 4;
  local_178 = 0;
  local_170 = &local_248;
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"a_texCoord","");
  local_278._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_1f8,local_1f0 + (long)local_1f8);
  local_250 = 0;
  local_168 = local_278._0_4_;
  plVar8 = local_150;
  local_160[0] = plVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_160,local_270,(long)local_268 + (long)local_270);
  local_140[0] = (ios_base)(undefined1)local_250;
  local_140[1] = (ios_base)local_250._1_1_;
  local_140[2] = (ios_base)local_250._2_1_;
  local_140[3] = (ios_base)local_250._3_1_;
  local_138 = 8;
  local_130 = local_28c;
  local_12c = 4;
  local_120 = local_200;
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  local_278._0_4_ = PRIMITIVETYPE_TRIANGLES;
  local_278._4_4_ = 6;
  local_270 = (long *)CONCAT44(local_270._4_4_,INDEXTYPE_UINT16);
  local_268 = renderQuad::indices;
  glu::draw(this->m_renderCtx,dVar6,2,(VertexArrayBinding *)local_1b8,(PrimitiveList *)local_278,
            (DrawUtilCallback *)0x0);
  lVar11 = -0xa0;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -10;
    lVar11 = lVar11 + 0x50;
  } while (lVar11 != 0);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, const RenderParams& params)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	tcu::Vec4				wCoord		= params.flags & RenderParams::PROJECTED ? params.w : tcu::Vec4(1.0f);
	bool					useBias		= !!(params.flags & RenderParams::USE_BIAS);
	bool					logUniforms	= !!(params.flags & RenderParams::LOG_UNIFORMS);

	// Render quad with texture.
	float position[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	Program progSpec	= PROGRAM_LAST;
	int		numComps	= 0;
	if (params.texType == TEXTURETYPE_2D)
	{
		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_2D_FLOAT_BIAS	: PROGRAM_2D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_2D_INT_BIAS	: PROGRAM_2D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_2D_UINT_BIAS	: PROGRAM_2D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_2D_SHADOW_BIAS	: PROGRAM_2D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_1D_FLOAT_BIAS	: PROGRAM_1D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_1D_INT_BIAS	: PROGRAM_1D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_1D_UINT_BIAS	: PROGRAM_1D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_1D_SHADOW_BIAS	: PROGRAM_1D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_CUBE_FLOAT_BIAS	: PROGRAM_CUBE_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_CUBE_INT_BIAS		: PROGRAM_CUBE_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_CUBE_UINT_BIAS		: PROGRAM_CUBE_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_CUBE_SHADOW_BIAS	: PROGRAM_CUBE_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_3D)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_3D_FLOAT_BIAS	: PROGRAM_3D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_3D_INT_BIAS	: PROGRAM_3D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_3D_UINT_BIAS	: PROGRAM_3D_UINT;		break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_2D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_2D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_2D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_2D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_2D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE_ARRAY)
	{
		DE_ASSERT(!useBias);

		numComps = 4;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_CUBE_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_CUBE_ARRAY_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_CUBE_ARRAY_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_CUBE_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_1D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_1D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_1D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_1D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_BUFFER)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FETCH_FLOAT:	progSpec = PROGRAM_BUFFER_FLOAT;	break;
			case SAMPLERTYPE_FETCH_INT:		progSpec = PROGRAM_BUFFER_INT;		break;
			case SAMPLERTYPE_FETCH_UINT:	progSpec = PROGRAM_BUFFER_UINT;		break;
			default:						DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	glu::ShaderProgram* program = m_programLibrary.getProgram(progSpec);

	// \todo [2012-09-26 pyry] Move to ProgramLibrary and log unique programs only(?)
	if (params.flags & RenderParams::LOG_PROGRAMS)
		m_log << *program;

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set vertex attributes");

	// Program and uniforms.
	deUint32 prog = program->getProgram();
	gl.useProgram(prog);

	gl.uniform1i(gl.getUniformLocation(prog, "u_sampler"), texUnit);
	if (logUniforms)
		m_log << TestLog::Message << "u_sampler = " << texUnit << TestLog::EndMessage;

	if (useBias)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_bias"), params.bias);
		if (logUniforms)
			m_log << TestLog::Message << "u_bias = " << params.bias << TestLog::EndMessage;
	}

	if (params.samplerType == SAMPLERTYPE_SHADOW)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_ref"), params.ref);
		if (logUniforms)
			m_log << TestLog::Message << "u_ref = " << params.ref << TestLog::EndMessage;
	}

	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorScale"),	1, params.colorScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorBias"),	1, params.colorBias.getPtr());

	if (logUniforms)
	{
		m_log << TestLog::Message << "u_colorScale = " << params.colorScale << TestLog::EndMessage;
		m_log << TestLog::Message << "u_colorBias = " << params.colorBias << TestLog::EndMessage;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set program state");

	{
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4,			4, 0, &position[0]),
			glu::va::Float("a_texCoord",	numComps,	4, 0, texCoord)
		};
		glu::draw(m_renderCtx, prog, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}
}